

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  ulong *puVar9;
  __sighandler_t p_Var10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _union_1457 _Var13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar14;
  _union_1457 *p_Var15;
  ulong uVar16;
  undefined8 uVar17;
  const_iterator cVar18;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  string internal_flag;
  ExecDeathTestArgs args_2;
  Arguments args;
  sigaction ignore_sigprof_action;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  _union_1457 local_2b8;
  long local_2b0;
  _union_1457 local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  int local_238;
  int local_234;
  string local_230;
  int local_20c;
  char *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  string local_1c8;
  _union_1457 local_1a0;
  undefined1 local_198 [8];
  ulong local_190;
  ulong uStack_188;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_238);
  if (iVar3 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_2d8 == puVar9) {
      local_2c8 = *puVar9;
      lStack_2c0 = puVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar9;
    }
    local_2d0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x46f;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar16 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar16 = local_2c8;
    }
    if (uVar16 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar17 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_001330d1;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_001330d1:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar12) {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
      lStack_2a0 = puVar7[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    }
    local_2b0 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_1a0.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_1a0.sa_handler == p_Var10) {
      local_190 = *(ulong *)p_Var10;
      uStack_188 = puVar7[3];
      local_1a0.sa_handler = (__sighandler_t)&local_190;
    }
    else {
      local_190 = *(ulong *)p_Var10;
    }
    local_198 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
LAB_001335d2:
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
    local_c8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar12) goto LAB_00132e9b;
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_00132ea6;
  }
  iVar3 = fcntl(local_234,2,0);
  if (iVar3 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_2d8 == puVar9) {
      local_2c8 = *puVar9;
      lStack_2c0 = puVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar9;
    }
    local_2d0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x472;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar16 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar16 = local_2c8;
    }
    if (uVar16 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar17 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_001331c7;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_001331c7:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar12) {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
      lStack_2a0 = puVar7[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    }
    local_2b0 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_1a0.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_1a0.sa_handler == p_Var10) {
      local_190 = *(ulong *)p_Var10;
      uStack_188 = puVar7[3];
      local_1a0.sa_handler = (__sighandler_t)&local_190;
    }
    else {
      local_190 = *(ulong *)p_Var10;
    }
    local_198 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    goto LAB_001335d2;
  }
  local_2f8 = &local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = plVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
    local_318 = (ulong *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = plVar6[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
    local_2d8 = (ulong *)*plVar6;
  }
  local_2d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var15 = (_union_1457 *)(plVar6 + 2);
  if ((_union_1457 *)*plVar6 == p_Var15) {
    local_2a8 = *p_Var15;
    lStack_2a0 = plVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = *p_Var15;
    local_2b8.sa_handler = (__sighandler_t)*plVar6;
  }
  local_2b0 = plVar6[1];
  *plVar6 = (long)p_Var15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_1a0.sa_handler = (__sighandler_t)&local_190;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if ((__sighandler_t)*plVar6 == p_Var10) {
    local_190 = *(ulong *)p_Var10;
    uStack_188 = plVar6[3];
  }
  else {
    local_190 = *(ulong *)p_Var10;
    local_1a0.sa_handler = (__sighandler_t)*plVar6;
  }
  local_198 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_e8 = &local_d8;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_d8 = *plVar11;
    lStack_d0 = plVar6[3];
  }
  else {
    local_d8 = *plVar11;
    local_e8 = (long *)*plVar6;
  }
  local_e0 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  if (local_1a0.sa_handler != (__sighandler_t)&local_190) {
    operator_delete(local_1a0.sa_handler);
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258.field_2._8_8_ = plVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar9;
    local_258._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_258._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = plVar6[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = (size_type)&local_288;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = plVar6[3];
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_298._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_298._8_8_ = plVar6[1];
  *plVar6 = (long)paVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_298._M_local_buf);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = plVar6[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
    local_2f8 = (ulong *)*plVar6;
  }
  local_2f0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = plVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
    local_318 = (ulong *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1c8,&this->line_);
  uVar16 = 0xf;
  if (local_318 != &local_308) {
    uVar16 = local_308;
  }
  if (uVar16 < local_1c8._M_string_length + local_310) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      uVar17 = local_1c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1c8._M_string_length + local_310) goto LAB_00131faa;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00131faa:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_1c8._M_dataplus._M_p);
  }
  puVar9 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
    local_2d8 = (ulong *)*puVar7;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var15 = (_union_1457 *)(plVar6 + 2);
  if ((_union_1457 *)*plVar6 == p_Var15) {
    local_2a8.sa_handler = p_Var15->sa_handler;
    lStack_2a0 = plVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8.sa_handler = p_Var15->sa_handler;
    local_2b8.sa_handler = (__sighandler_t)*plVar6;
  }
  local_2b0 = plVar6[1];
  *plVar6 = (long)p_Var15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1e8,&local_20c);
  p_Var10 = (__sighandler_t)
            (CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) + local_2b0)
  ;
  _Var13 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    _Var13 = local_2a8;
  }
  if ((ulong)_Var13 < p_Var10) {
    uVar17 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar17 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < p_Var10) goto LAB_001320bd;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_001320bd:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_1a0.sa_handler = (__sighandler_t)&local_190;
  p_Var10 = (__sighandler_t)(puVar7 + 2);
  if ((__sighandler_t)*puVar7 == p_Var10) {
    local_190 = *(ulong *)p_Var10;
    uStack_188 = puVar7[3];
  }
  else {
    local_190 = *(ulong *)p_Var10;
    local_1a0.sa_handler = (__sighandler_t)*puVar7;
  }
  local_198 = (undefined1  [8])puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *p_Var10 = (__sighandler_t)0x0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  StreamableToString<int>(&local_108,&local_234);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar17 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_c0 + local_108._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
        &local_108.field_2) {
      uVar17 = local_108.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_c0 + local_108._M_string_length) goto LAB_00132206;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00132206:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        (ulong)CONCAT44(local_108._M_dataplus._M_p._4_4_,
                                        local_108._M_dataplus._M_p._0_4_));
  }
  local_208 = (char *)&local_1f8;
  pcVar1 = (char *)(puVar7 + 2);
  if ((char *)*puVar7 == pcVar1) {
    local_1f8 = *(undefined8 *)pcVar1;
    uStack_1f0 = puVar7[3];
  }
  else {
    local_1f8 = *(undefined8 *)pcVar1;
    local_208 = (char *)*puVar7;
  }
  local_200 = puVar7[1];
  *puVar7 = pcVar1;
  puVar7[1] = 0;
  *pcVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
      &local_108.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  if (local_1a0.sa_handler != (__sighandler_t)&local_190) {
    operator_delete(local_1a0.sa_handler);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_c8.sa_handler = (__sighandler_t)0x0;
  std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
            ((vector<char*,std::allocator<char*>> *)&local_1c8,(iterator)0x0,
             (char **)&local_c8.sa_handler);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_c8,__x);
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  cVar18._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_e8);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar18,
             (value_type *)&local_c8.sa_handler);
  cVar18._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup(local_208);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar18,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_1e8._M_dataplus._M_p = local_1c8._M_dataplus._M_p;
  local_1e8._M_string_length._0_4_ = local_238;
  memset(&local_1a0,0,0x98);
  sigemptyset((sigset_t *)local_198);
  local_1a0 = (_union_1457)0x1;
  do {
    iVar3 = sigaction(0x1b,(sigaction *)&local_1a0,(sigaction *)&local_c8);
    if (iVar3 != -1) {
      if (FLAGS_gtest_death_test_use_fork != '\0') {
        iVar3 = fork();
        if (iVar3 == 0) {
          ExecDeathTestChildMain(&local_1e8);
          goto LAB_001331e3;
        }
LAB_0013263c:
        goto LAB_00132644;
      }
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_001331e3:
        AssumeRole();
      }
      uVar4 = getpagesize();
      __len = (size_t)(int)uVar4;
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"CHECK failed: File ","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_298._M_allocated_capacity = *puVar7;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity == paVar12) {
          local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._8_8_ = puVar7[3];
          local_298._M_allocated_capacity = (size_type)&local_288;
        }
        else {
          local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_298._8_8_ = puVar7[1];
        *puVar7 = paVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
        local_2f8 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_2f8 == puVar9) {
          local_2e8 = *puVar9;
          lStack_2e0 = puVar7[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *puVar9;
        }
        local_2f0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x439;
        StreamableToString<int>(&local_258,(int *)&local_230);
        uVar16 = 0xf;
        if (local_2f8 != &local_2e8) {
          uVar16 = local_2e8;
        }
        if (uVar16 < local_258._M_string_length + local_2f0) {
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            uVar17 = local_258.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_258._M_string_length + local_2f0) goto LAB_00133707;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_00133707:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
        }
        local_318 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_318 == puVar9) {
          local_308 = *puVar9;
          lStack_300 = puVar7[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar9;
        }
        local_310 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        local_2d8 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_2d8 == puVar9) {
          local_2c8 = *puVar9;
          lStack_2c0 = puVar7[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *puVar9;
        }
        local_2d0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
      }
      else {
        lVar14 = 0;
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
          lVar14 = __len - 0x40;
        }
        if ((uVar4 < 0x41) || (((ulong)(lVar14 + (long)__addr) & 0x3f) != 0)) {
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar12) {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._8_8_ = puVar7[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2f8 == puVar9) {
            local_2e8 = *puVar9;
            lStack_2e0 = puVar7[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar9;
          }
          local_2f0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x446;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar16 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar16 = local_2e8;
          }
          if (uVar16 < local_258._M_string_length + local_2f0) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar17 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_258._M_string_length + local_2f0) goto LAB_00133813;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_00133813:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_318 == puVar9) {
            local_308 = *puVar9;
            lStack_300 = puVar7[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar9;
          }
          local_310 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2d8 == puVar9) {
            local_2c8 = *puVar9;
            lStack_2c0 = puVar7[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar9;
          }
          local_2d0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
        }
        else {
          iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar14 + (long)__addr),0x11,&local_1e8);
          iVar5 = munmap(__addr,__len);
          if (iVar5 != -1) goto LAB_0013263c;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar12) {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._8_8_ = puVar7[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2f8 == puVar9) {
            local_2e8 = *puVar9;
            lStack_2e0 = puVar7[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar9;
          }
          local_2f0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x44a;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar16 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar16 = local_2e8;
          }
          if (uVar16 < local_258._M_string_length + local_2f0) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar17 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_258._M_string_length + local_2f0) goto LAB_0013391f;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_0013391f:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_318 == puVar9) {
            local_308 = *puVar9;
            lStack_300 = puVar7[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar9;
          }
          local_310 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_2d8 == puVar9) {
            local_2c8 = *puVar9;
            lStack_2c0 = puVar7[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar9;
          }
          local_2d0 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
        }
      }
      goto LAB_00132cf5;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*puVar7;
  puVar9 = puVar7 + 2;
  if ((ulong *)local_278._M_dataplus._M_p == puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = puVar7[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
  }
  local_278._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = puVar7[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_298._8_8_ = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_108._M_dataplus._M_p._0_4_ = 0x42d;
  StreamableToString<int>(&local_230,(int *)&local_108);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar17 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_230._M_string_length + local_298._8_8_) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar17 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_230._M_string_length + local_298._8_8_) goto LAB_001328d6;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_001328d6:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  goto LAB_00132c9a;
LAB_001326d9:
  do {
    iVar5 = close(local_234);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_238;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1c8);
      if (local_208 != (char *)&local_1f8) {
        operator_delete(local_208);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_298._M_allocated_capacity = (size_type)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_258._M_dataplus._M_p._0_4_ = 0x489;
  StreamableToString<int>(&local_278,(int *)&local_258);
  uVar16 = 0xf;
  if (local_318 != &local_308) {
    uVar16 = local_308;
  }
  if (uVar16 < local_278._M_string_length + local_310) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar17 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_278._M_string_length + local_310) goto LAB_00132b06;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00132b06:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_278._M_dataplus._M_p);
  }
  local_2d8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2d8 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar12) {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    lStack_2a0 = puVar7[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
  }
  local_2b0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_1a0.sa_handler = (__sighandler_t)*plVar6;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if (local_1a0.sa_handler == p_Var10) {
    local_190 = *(ulong *)p_Var10;
    uStack_188 = plVar6[3];
    local_1a0.sa_handler = (__sighandler_t)&local_190;
  }
  else {
    local_190 = *(ulong *)p_Var10;
  }
  local_198 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
  local_c8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_00132e9b:
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
  }
LAB_00132ea6:
  _Var13 = *(_union_1457 *)(puVar7 + 1);
  p_Var15 = &local_c8;
  goto LAB_00132eb2;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00132644:
    iVar5 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar3 != -1) goto LAB_001326d9;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_allocated_capacity = *puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity == paVar12) {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_288._8_8_ = puVar7[3];
        local_298._M_allocated_capacity = (size_type)&local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_298._8_8_ = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
      local_2f8 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_2f8 == puVar9) {
        local_2e8 = *puVar9;
        lStack_2e0 = puVar7[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar9;
      }
      local_2f0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x45a;
      StreamableToString<int>(&local_258,(int *)&local_230);
      uVar16 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar16 = local_2e8;
      }
      if (uVar16 < local_258._M_string_length + local_2f0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar17 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_258._M_string_length + local_2f0) goto LAB_00133434;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_00133434:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
      }
      local_318 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_318 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = puVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar9;
      }
      local_310 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_2d8 == puVar9) {
        local_2c8 = *puVar9;
        lStack_2c0 = puVar7[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8 = *puVar9;
      }
      local_2d0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      goto LAB_00132cf5;
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*puVar7;
  puVar9 = puVar7 + 2;
  if ((ulong *)local_278._M_dataplus._M_p == puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = puVar7[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
  }
  local_278._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar12) {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_288._8_8_ = puVar7[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_298._8_8_ = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_108._M_dataplus._M_p._0_4_ = 0x457;
  StreamableToString<int>(&local_230,(int *)&local_108);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar17 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_230._M_string_length + local_298._8_8_) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar17 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_230._M_string_length + local_298._8_8_) goto LAB_00132a03;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_00132a03:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2f8 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
  }
  local_2f0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
LAB_00132c9a:
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_2d8 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
  }
  local_2d0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
LAB_00132cf5:
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar12) {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
    lStack_2a0 = puVar7[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar12->_M_allocated_capacity;
  }
  _Var13 = *(_union_1457 *)(puVar7 + 1);
  p_Var15 = &local_2b8;
LAB_00132eb2:
  p_Var15[1] = _Var13;
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)p_Var15);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}